

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

size_t __thiscall adios2::Engine::CurrentStep(Engine *this)

{
  size_t sVar1;
  undefined8 *in_RDI;
  string *in_stack_00000068;
  Engine *in_stack_00000070;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"in call to Engine::CurrentStep",&local_29);
  helper::CheckForNullptr<adios2::core::Engine>(in_stack_00000070,in_stack_00000068);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  sVar1 = (**(code **)(*(long *)*in_RDI + 0x20))();
  return sVar1;
}

Assistant:

size_t Engine::CurrentStep() const
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::CurrentStep");
    return m_Engine->CurrentStep();
}